

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.cpp
# Opt level: O1

void * __thiscall
pstd::pmr::NewDeleteResource::do_allocate(NewDeleteResource *this,size_t size,size_t alignment)

{
  int iVar1;
  void *pvVar2;
  void *ptr;
  void *local_8;
  
  if (alignment < 8) {
    pvVar2 = malloc(size);
    return pvVar2;
  }
  local_8 = (void *)size;
  iVar1 = posix_memalign(&local_8,alignment,size);
  if (iVar1 != 0) {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *do_allocate(size_t size, size_t alignment) {
#if defined(PBRT_HAVE__ALIGNED_MALLOC)
        return _aligned_malloc(size, alignment);
#elif defined(PBRT_HAVE_POSIX_MEMALIGN)
        void *ptr;
        if (alignment < sizeof(void *))
            return malloc(size);
        if (posix_memalign(&ptr, alignment, size) != 0)
            ptr = nullptr;
        return ptr;
#else
        return memalign(alignment, size);
#endif
    }